

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict_main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  Timer timer;
  Solver solver;
  string local_2f0;
  Timer local_2d0;
  Solver local_2c0;
  
  Timer::Timer(&local_2d0);
  Timer::tic(&local_2d0);
  xLearn::Solver::Solver(&local_2c0);
  local_2c0.hyper_param_.is_train = false;
  xLearn::Solver::Initialize(&local_2c0,argc,argv);
  xLearn::Solver::StartWork(&local_2c0);
  xLearn::Solver::Clear(&local_2c0);
  fVar1 = Timer::toc(&local_2d0);
  StringPrintf_abi_cxx11_(&local_2f0,"Total time cost: %.2f (sec)",(double)fVar1);
  Color::print_info(&local_2f0,false);
  std::__cxx11::string::~string((string *)&local_2f0);
  xLearn::Solver::~Solver(&local_2c0);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  Timer timer;
  timer.tic();

  xLearn::Solver solver;
  solver.SetPredict();
  solver.Initialize(argc, argv);
  solver.StartWork();
  solver.Clear();

  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), false);

  return 0;
}